

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_string_tests.cpp
# Opt level: O2

void __thiscall
util_string_tests::ConstevalFormatString_NumSpec::test_method(ConstevalFormatString_NumSpec *this)

{
  long lVar1;
  long in_FS_OFFSET;
  string_view error;
  string_view error_00;
  string_view error_01;
  string_view error_02;
  string_view error_03;
  string_view error_04;
  string_view error_05;
  string_view error_06;
  string_view error_07;
  string_view error_08;
  string_view error_09;
  string_view error_10;
  string_view wrong_fmt;
  string_view wrong_fmt_00;
  string_view wrong_fmt_01;
  string_view wrong_fmt_02;
  string_view wrong_fmt_03;
  string_view wrong_fmt_04;
  string_view wrong_fmt_05;
  string_view wrong_fmt_06;
  string_view wrong_fmt_07;
  string_view wrong_fmt_08;
  string_view wrong_fmt_09;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  PassFmt<0u>((ConstevalFormatString<0U>)0xc694e1);
  PassFmt<0u>((ConstevalFormatString<0U>)0xb6a8ed);
  PassFmt<1u>((ConstevalFormatString<1U>)0xe2410c);
  PassFmt<0u>((ConstevalFormatString<0U>)0xc686df);
  PassFmt<0u>((ConstevalFormatString<0U>)0xc686e4);
  PassFmt<1u>((ConstevalFormatString<1U>)0xc686de);
  PassFmt<1u>((ConstevalFormatString<1U>)0xc686e3);
  PassFmt<0u>((ConstevalFormatString<0U>)0xc686e8);
  PassFmt<1u>((ConstevalFormatString<1U>)0xc686f1);
  PassFmt<1u>((ConstevalFormatString<1U>)0xc686ed);
  PassFmt<2u>((ConstevalFormatString<2U>)0xc686ff);
  PassFmt<2u>((ConstevalFormatString<2U>)0xc686f6);
  PassFmt<129u>((ConstevalFormatString<129U>)0xc68704);
  PassFmt<1u>((ConstevalFormatString<1U>)0xc68716);
  PassFmt<1u>((ConstevalFormatString<1U>)0xc6871b);
  PassFmt<1u>((ConstevalFormatString<1U>)0xc68720);
  PassFmt<1u>((ConstevalFormatString<1U>)0xc68725);
  PassFmt<1u>((ConstevalFormatString<1U>)0xc6872b);
  PassFmt<1u>((ConstevalFormatString<1U>)0xc6872f);
  PassFmt<1u>((ConstevalFormatString<1U>)0xc68735);
  PassFmt<1u>((ConstevalFormatString<1U>)0xc6873c);
  PassFmt<1u>((ConstevalFormatString<1U>)0xc68743);
  PassFmt<1u>((ConstevalFormatString<1U>)0xc68749);
  PassFmt<1u>((ConstevalFormatString<1U>)0xc68750);
  PassFmt<1u>((ConstevalFormatString<1U>)0xcd28ac);
  PassFmt<1u>((ConstevalFormatString<1U>)0xc68753);
  PassFmt<2u>((ConstevalFormatString<2U>)0xc68757);
  PassFmt<1u>((ConstevalFormatString<1U>)0xc6875f);
  error._M_str = "Format specifiers must be all positional or all non-positional!";
  error._M_len = 0x3f;
  wrong_fmt._M_str = "%s%1$s";
  wrong_fmt._M_len = 6;
  FailFmtWithError<1u>(wrong_fmt,error);
  error_00._M_str = "Format specifier count must match the argument count!";
  error_00._M_len = 0x35;
  FailFmtWithError<1u>((string_view)(ZEXT816(0xc694e1) << 0x40),error_00);
  error_01._M_str = "Format specifier count must match the argument count!";
  error_01._M_len = 0x35;
  wrong_fmt_00._M_str = "%s";
  wrong_fmt_00._M_len = 2;
  FailFmtWithError<0u>(wrong_fmt_00,error_01);
  error_02._M_str = "Format specifier count must match the argument count!";
  error_02._M_len = 0x35;
  wrong_fmt_01._M_str = "%s";
  wrong_fmt_01._M_len = 2;
  FailFmtWithError<2u>(wrong_fmt_01,error_02);
  error_03._M_str = "Format specifier count must match the argument count!";
  error_03._M_len = 0x35;
  wrong_fmt_02._M_str = "%1$s";
  wrong_fmt_02._M_len = 4;
  FailFmtWithError<0u>(wrong_fmt_02,error_03);
  error_04._M_str = "Format specifier count must match the argument count!";
  error_04._M_len = 0x35;
  wrong_fmt_03._M_str = "%1$s";
  wrong_fmt_03._M_len = 4;
  FailFmtWithError<2u>(wrong_fmt_03,error_04);
  error_05._M_str = "Positional format specifier must have position of at least 1";
  error_05._M_len = 0x3c;
  wrong_fmt_04._M_str = "%$s";
  wrong_fmt_04._M_len = 3;
  FailFmtWithError<1u>(wrong_fmt_04,error_05);
  error_06._M_str = "Positional format specifier must have position of at least 1";
  error_06._M_len = 0x3c;
  wrong_fmt_05._M_str = "%$";
  wrong_fmt_05._M_len = 2;
  FailFmtWithError<1u>(wrong_fmt_05,error_06);
  error_07._M_str = "Positional format specifier must have position of at least 1";
  error_07._M_len = 0x3c;
  wrong_fmt_06._M_str = "%0$";
  wrong_fmt_06._M_len = 3;
  FailFmtWithError<0u>(wrong_fmt_06,error_07);
  error_08._M_str = "Positional format specifier must have position of at least 1";
  error_08._M_len = 0x3c;
  wrong_fmt_07._M_str = "%0$s";
  wrong_fmt_07._M_len = 4;
  FailFmtWithError<0u>(wrong_fmt_07,error_08);
  error_09._M_str = "Format specifier incorrectly terminated by end of string";
  error_09._M_len = 0x38;
  wrong_fmt_08._M_str = "%";
  wrong_fmt_08._M_len = 1;
  FailFmtWithError<1u>(wrong_fmt_08,error_09);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    error_10._M_str = "Format specifier incorrectly terminated by end of string";
    error_10._M_len = 0x38;
    wrong_fmt_09._M_str = "%1$";
    wrong_fmt_09._M_len = 3;
    FailFmtWithError<1u>(wrong_fmt_09,error_10);
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(ConstevalFormatString_NumSpec)
{
    PassFmt<0>("");
    PassFmt<0>("%%");
    PassFmt<1>("%s");
    PassFmt<0>("%%s");
    PassFmt<0>("s%%");
    PassFmt<1>("%%%s");
    PassFmt<1>("%s%%");
    PassFmt<0>(" 1$s");
    PassFmt<1>("%1$s");
    PassFmt<1>("%1$s%1$s");
    PassFmt<2>("%2$s");
    PassFmt<2>("%2$s 4$s %2$s");
    PassFmt<129>("%129$s 999$s %2$s");
    PassFmt<1>("%02d");
    PassFmt<1>("%+2s");
    PassFmt<1>("%.6i");
    PassFmt<1>("%5.2f");
    PassFmt<1>("%#x");
    PassFmt<1>("%1$5i");
    PassFmt<1>("%1$-5i");
    PassFmt<1>("%1$.5i");
    // tinyformat accepts almost any "type" spec, even '%', or '_', or '\n'.
    PassFmt<1>("%123%");
    PassFmt<1>("%123%s");
    PassFmt<1>("%_");
    PassFmt<1>("%\n");

    // The `*` specifier behavior is unsupported and can lead to runtime
    // errors when used in a ConstevalFormatString. Please refer to the
    // note in the ConstevalFormatString docs.
    PassFmt<1>("%*c");
    PassFmt<2>("%2$*3$d");
    PassFmt<1>("%.*f");

    auto err_mix{"Format specifiers must be all positional or all non-positional!"};
    FailFmtWithError<1>("%s%1$s", err_mix);

    auto err_num{"Format specifier count must match the argument count!"};
    FailFmtWithError<1>("", err_num);
    FailFmtWithError<0>("%s", err_num);
    FailFmtWithError<2>("%s", err_num);
    FailFmtWithError<0>("%1$s", err_num);
    FailFmtWithError<2>("%1$s", err_num);

    auto err_0_pos{"Positional format specifier must have position of at least 1"};
    FailFmtWithError<1>("%$s", err_0_pos);
    FailFmtWithError<1>("%$", err_0_pos);
    FailFmtWithError<0>("%0$", err_0_pos);
    FailFmtWithError<0>("%0$s", err_0_pos);

    auto err_term{"Format specifier incorrectly terminated by end of string"};
    FailFmtWithError<1>("%", err_term);
    FailFmtWithError<1>("%1$", err_term);
}